

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,unsigned_int>,absl::lts_20250127::hash_internal::Hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
::construct<std::piecewise_construct_t_const&,std::tuple<unsigned_int&&>,std::tuple<>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,unsigned_int>,absl::lts_20250127::hash_internal::Hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
           *this,slot_type *slot,piecewise_construct_t *args,tuple<unsigned_int_&&> *args_1,
          tuple<> *args_2)

{
  size_t c;
  
  c = *(size_t *)this;
  *(undefined8 *)this = 0xffffffffffffff9c;
  (slot->value).first =
       *(args_1->super__Tuple_impl<0UL,_unsigned_int_&&>).
        super__Head_base<0UL,_unsigned_int_&&,_false>._M_head_impl;
  (slot->value).second = 0;
  CommonFields::set_capacity((CommonFields *)this,c);
  return;
}

Assistant:

size_t capacity() const { return capacity_; }